

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.cc
# Opt level: O0

void __thiscall tcmalloc::ThreadCache::Scavenge(ThreadCache *this)

{
  FreeList *this_00;
  uint uVar1;
  uint uVar2;
  SizeMap *this_01;
  size_t sVar3;
  int *piVar4;
  int local_40;
  int local_30;
  int local_2c;
  int local_28;
  int batch_size;
  int drop;
  int lowmark;
  FreeList *list;
  ThreadCache *pTStack_10;
  int cl;
  ThreadCache *this_local;
  
  pTStack_10 = this;
  for (list._4_4_ = 0; uVar1 = list._4_4_, uVar2 = Static::num_size_classes(), uVar1 < uVar2;
      list._4_4_ = list._4_4_ + 1) {
    _drop = this->list_ + (int)list._4_4_;
    batch_size = FreeList::lowwatermark(_drop);
    if (0 < batch_size) {
      if (batch_size < 2) {
        local_40 = 1;
      }
      else {
        local_40 = batch_size / 2;
      }
      local_28 = local_40;
      ReleaseToCentralCache(this,_drop,list._4_4_,local_40);
      this_01 = Static::sizemap();
      local_2c = SizeMap::num_objects_to_move(this_01,list._4_4_);
      sVar3 = FreeList::max_length(_drop);
      this_00 = _drop;
      if ((ulong)(long)local_2c < sVar3) {
        sVar3 = FreeList::max_length(_drop);
        local_30 = (int)sVar3 - local_2c;
        piVar4 = std::max<int>(&local_30,&local_2c);
        FreeList::set_max_length(this_00,(long)*piVar4);
      }
    }
    FreeList::clear_lowwatermark(_drop);
  }
  IncreaseCacheLimit(this);
  return;
}

Assistant:

void ThreadCache::Scavenge() {
  // If the low-water mark for the free list is L, it means we would
  // not have had to allocate anything from the central cache even if
  // we had reduced the free list size by L.  We aim to get closer to
  // that situation by dropping L/2 nodes from the free list.  This
  // may not release much memory, but if so we will call scavenge again
  // pretty soon and the low-water marks will be high on that call.
  for (int cl = 0; cl < Static::num_size_classes(); cl++) {
    FreeList* list = &list_[cl];
    const int lowmark = list->lowwatermark();
    if (lowmark > 0) {
      const int drop = (lowmark > 1) ? lowmark/2 : 1;
      ReleaseToCentralCache(list, cl, drop);

      // Shrink the max length if it isn't used.  Only shrink down to
      // batch_size -- if the thread was active enough to get the max_length
      // above batch_size, it will likely be that active again.  If
      // max_length shinks below batch_size, the thread will have to
      // go through the slow-start behavior again.  The slow-start is useful
      // mainly for threads that stay relatively idle for their entire
      // lifetime.
      const int batch_size = Static::sizemap()->num_objects_to_move(cl);
      if (list->max_length() > batch_size) {
        list->set_max_length(
          std::max<int>(list->max_length() - batch_size, batch_size));
      }
    }
    list->clear_lowwatermark();
  }

  IncreaseCacheLimit();
}